

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O3

chunk * cave_generate(player *p,wchar_t height,wchar_t width)

{
  ushort uVar1;
  undefined2 uVar2;
  quest *pqVar3;
  _Bool _Var4;
  uint32_t uVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  uint32_t y;
  dun_data *pdVar8;
  chunk_conflict2 *pcVar9;
  object **ppoVar10;
  ulong uVar11;
  loc *plVar12;
  int *piVar13;
  loc **pplVar14;
  level *plVar15;
  chunk_conflict *pcVar16;
  connector *pcVar17;
  cave_profile *pcVar18;
  angband_constants *paVar19;
  loc lVar20;
  square *psVar21;
  connector *pcVar22;
  feature *pfVar23;
  bitflag *pbVar24;
  char cVar25;
  int iVar26;
  byte bVar27;
  long lVar28;
  char *pcVar29;
  dun_data *dd;
  uint uVar30;
  wchar_t y_00;
  cave_profile *pcVar31;
  cave_profile *pcVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  loc grid;
  dun_data dun_body;
  char *local_140;
  wchar_t local_134;
  wchar_t local_130;
  uint local_12c;
  loc_conflict local_128;
  undefined6 uStack_120;
  undefined2 uStack_11a;
  undefined1 auStack_118 [14];
  undefined2 local_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined2 uStack_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  dun_data local_e0;
  
  if (p->upkeep->arena_level != false) {
    event_signal_string(EVENT_GEN_LEVEL_START,"arena");
    pdVar8 = (dun_data *)arena_gen(p,height,width);
    pcVar9 = (chunk_conflict2 *)
             cave_new(*(wchar_t *)&pdVar8->ent,*(wchar_t *)((long)&pdVar8->ent + 4));
    p->cave = pcVar9;
    pcVar9->depth = *(wchar_t *)&pdVar8->field_0xc;
    ppoVar10 = (object **)mem_realloc(pcVar9->objects,(ulong)(ushort)pdVar8->block_hgt * 8 + 8);
    pcVar9 = p->cave;
    pcVar9->objects = ppoVar10;
    pcVar9->obj_max = (uint16_t)pdVar8->block_hgt;
    uVar11 = 0xffffffffffffffff;
    do {
      pcVar9->objects[uVar11 + 1] = (object *)0x0;
      pcVar9 = p->cave;
      uVar11 = uVar11 + 1;
    } while (uVar11 < pcVar9->obj_max);
    wiz_light((chunk *)pdVar8,p,false);
    goto LAB_00158d68;
  }
  local_f8 = -0x3333;
  sStack_f6 = -0x3333;
  sStack_f4 = 0x6db7;
  sStack_f2 = 0x6db7;
  sStack_f0 = -0x745d;
  sStack_ee = -0x745d;
  sStack_ec = 0x4ec5;
  sStack_ea = 0x4ec5;
  local_108 = 0x3333;
  uStack_106 = 0x3333;
  uStack_104 = 0x2492;
  uStack_102 = 0x2492;
  uStack_100 = 0x1745;
  uStack_fe = 0x1745;
  uStack_fc = 0x13b1;
  uStack_fa = 0x13b1;
  local_134 = height;
  local_130 = width;
  uVar30 = 0;
  do {
    local_12c = uVar30;
    local_140 = (char *)0x0;
    character_dungeon = false;
    dun = &local_e0;
    plVar12 = (loc *)mem_zalloc((ulong)z_info->level_room_max << 3);
    dun->cent = plVar12;
    piVar13 = (int *)mem_zalloc((ulong)z_info->level_room_max << 2);
    dun->ent_n = piVar13;
    pplVar14 = (loc **)mem_zalloc((ulong)z_info->level_room_max << 3);
    pdVar8 = dun;
    dun->ent = pplVar14;
    pdVar8->ent2room = (int **)0x0;
    plVar12 = (loc *)mem_zalloc((ulong)z_info->level_door_max << 3);
    dun->door = plVar12;
    plVar12 = (loc *)mem_zalloc((ulong)z_info->wall_pierce_max << 3);
    dun->wall = plVar12;
    plVar12 = (loc *)mem_zalloc((ulong)z_info->tunn_grid_max << 3);
    pdVar8 = dun;
    dun->tunn = plVar12;
    pdVar8->one_off_below = (connector *)0x0;
    pdVar8->curr_join = (connector *)0x0;
    pdVar8->join = (connector *)0x0;
    pdVar8->one_off_above = (connector *)0x0;
    pdVar8->nstair_room = L'\0';
    _Var4 = is_quest(p,(int)p->depth);
    pdVar8 = dun;
    dun->quest = _Var4;
    if ((p->opts).opt[0x2b] == true) {
      pdVar8->persist = true;
      plVar15 = level_by_depth(p->depth + L'\xffffffff');
      if ((plVar15 == (level *)0x0) ||
         (pcVar16 = chunk_find_name(plVar15->name), pcVar16 == (chunk_conflict *)0x0)) {
        plVar15 = level_by_depth(p->depth + L'\xfffffffe');
        if ((plVar15 != (level *)0x0) &&
           (pcVar16 = chunk_find_name(plVar15->name), pcVar16 != (chunk_conflict *)0x0)) {
          for (pcVar22 = pcVar16->join; pcVar22 != (connector *)0x0; pcVar22 = pcVar22->next) {
            if (pcVar22->feat == '\x06') {
              pcVar17 = (connector *)mem_zalloc(0x20);
              pcVar17->grid = pcVar22->grid;
              pcVar17->feat = '\x06';
              pcVar17->next = pdVar8->one_off_above;
              pdVar8->one_off_above = pcVar17;
            }
          }
        }
      }
      else {
        for (pcVar22 = pcVar16->join; pcVar22 != (connector *)0x0; pcVar22 = pcVar22->next) {
          if (pcVar22->feat == '\x06') {
            pcVar17 = (connector *)mem_zalloc(0x20);
            pcVar17->grid = pcVar22->grid;
            pcVar17->feat = '\x05';
            pcVar17->next = pdVar8->join;
            pdVar8->join = pcVar17;
          }
        }
      }
      plVar15 = level_by_depth(p->depth + L'\x01');
      if ((plVar15 == (level *)0x0) ||
         (pcVar16 = chunk_find_name(plVar15->name), pcVar16 == (chunk_conflict *)0x0)) {
        plVar15 = level_by_depth(p->depth + L'\x02');
        if ((plVar15 != (level *)0x0) &&
           (pcVar16 = chunk_find_name(plVar15->name), pcVar16 != (chunk_conflict *)0x0)) {
          for (pcVar22 = pcVar16->join; pcVar22 != (connector *)0x0; pcVar22 = pcVar22->next) {
            if (pcVar22->feat == '\x05') {
              pcVar17 = (connector *)mem_zalloc(0x20);
              pcVar17->grid = pcVar22->grid;
              pcVar17->feat = '\x05';
              pcVar17->next = pdVar8->one_off_below;
              pdVar8->one_off_below = pcVar17;
            }
          }
        }
      }
      else {
        for (pcVar22 = pcVar16->join; pcVar22 != (connector *)0x0; pcVar22 = pcVar22->next) {
          if (pcVar22->feat == '\x05') {
            pcVar17 = (connector *)mem_zalloc(0x20);
            pcVar17->grid = pcVar22->grid;
            pcVar17->feat = '\x06';
            pcVar17->next = pdVar8->join;
            pdVar8->join = pcVar17;
          }
        }
      }
    }
    else {
      pdVar8->persist = false;
    }
    pcVar18 = find_cave_profile("moria");
    wVar6 = pcVar18->alloc;
    pcVar18 = find_cave_profile("labyrinth");
    wVar7 = pcVar18->alloc;
    if ((p->noscore & 0x10) == 0) {
LAB_00158649:
      pcVar29 = "town";
      if (p->depth != 0) {
        _Var4 = is_quest(p,(int)p->depth);
        pcVar29 = "classic";
        if (!_Var4) {
          uVar1 = p->depth;
          if (0xc < (short)uVar1) {
            uVar30 = (uint)uVar1;
            auVar33 = pshuflw(ZEXT416(uVar30),ZEXT416(uVar30),0);
            auVar34._0_2_ = auVar33._0_2_ * local_f8;
            auVar34._2_2_ = auVar33._0_2_ * sStack_f6;
            auVar34._4_2_ = auVar33._2_2_ * sStack_f4;
            auVar34._6_2_ = auVar33._2_2_ * sStack_f2;
            auVar34._8_2_ = auVar33._4_2_ * sStack_f0;
            auVar34._10_2_ = auVar33._4_2_ * sStack_ee;
            auVar34._12_2_ = auVar33._6_2_ * sStack_ec;
            auVar34._14_2_ = auVar33._6_2_ * sStack_ea;
            auVar33._2_2_ = uStack_106;
            auVar33._0_2_ = local_108;
            auVar33._4_2_ = uStack_104;
            auVar33._6_2_ = uStack_102;
            auVar33._8_2_ = uStack_100;
            auVar33._10_2_ = uStack_fe;
            auVar33._12_2_ = uStack_fc;
            auVar33._14_2_ = uStack_fa;
            auVar33 = psubusw(auVar34,auVar33);
            auVar35._0_2_ = -(ushort)(auVar33._0_2_ == 0);
            auVar35._2_2_ = -(ushort)(auVar33._2_2_ == 0);
            auVar35._4_2_ = -(ushort)(auVar33._4_2_ == 0);
            auVar35._6_2_ = -(ushort)(auVar33._6_2_ == 0);
            auVar35._8_2_ = -(ushort)(auVar33._8_2_ == 0);
            auVar35._10_2_ = -(ushort)(auVar33._10_2_ == 0);
            auVar35._12_2_ = -(ushort)(auVar33._12_2_ == 0);
            auVar35._14_2_ = -(ushort)(auVar33._14_2_ == 0);
            iVar26 = movmskps(uVar30 * -0x5555,auVar35);
            uVar5 = Rand_div(100);
            if (((int)uVar5 <
                 (int)(((uint)(0x4332322132212110 >> ((byte)(iVar26 << 2) & 0x3f)) & 7) + 2 +
                      (uint)((uVar30 * -0x5555 & 0xffff) < 0x5556))) &&
               (pcVar29 = "labyrinth", wVar7 == L'\xffffffff' || L'\0' < wVar7)) goto LAB_001587b9;
          }
          uVar2 = p->depth;
          if (((0x1d < (ushort)(uVar2 - 10)) ||
              ((uVar5 = Rand_div(0x28), uVar5 != 0 ||
               (pcVar29 = "moria", wVar6 != L'\xffffffff' && wVar6 < L'\x01')))) &&
             (pcVar29 = "classic", z_info->profile_max != 0)) {
            lVar28 = 0;
            uVar11 = 0;
            uVar5 = 0;
            pcVar18 = (cave_profile *)0x0;
            paVar19 = z_info;
            pcVar32 = cave_profiles;
            do {
              iVar26 = *(int *)((long)&pcVar32->alloc + lVar28);
              if ((0 < iVar26) && (*(int *)((long)&pcVar32->min_level + lVar28) <= (int)p->depth)) {
                pcVar31 = (cave_profile *)((long)&pcVar32->next + lVar28);
                uVar5 = uVar5 + iVar26;
                wVar6 = Rand_div(uVar5);
                paVar19 = z_info;
                pcVar32 = cave_profiles;
                if (wVar6 < pcVar31->alloc) {
                  pcVar18 = pcVar31;
                }
              }
              uVar11 = uVar11 + 1;
              lVar28 = lVar28 + 0x80;
            } while (uVar11 < paVar19->profile_max);
            pcVar29 = "classic";
            if (pcVar18 != (cave_profile *)0x0) goto LAB_001587d7;
          }
        }
      }
LAB_001587b9:
      pcVar18 = find_cave_profile(pcVar29);
      if (pcVar18 == (cave_profile *)0x0) {
        quit("Failed to find cave profile!");
        pcVar18 = (cave_profile *)0x0;
      }
    }
    else {
      auStack_118 = SUB1614((undefined1  [16])0x0,2);
      local_128.x = 0;
      local_128.y = 0;
      uStack_120 = 0;
      uStack_11a = 0;
      p->noscore = p->noscore & 0xffef;
      _Var4 = get_string("Profile name (eg classic): ",(char *)&local_128,0x1e);
      if ((!_Var4) ||
         (pcVar18 = find_cave_profile((char *)&local_128), pcVar18 == (cave_profile *)0x0))
      goto LAB_00158649;
    }
LAB_001587d7:
    dun->profile = pcVar18;
    event_signal_string(EVENT_GEN_LEVEL_START,dun->profile->name);
    pcVar29 = (char *)p;
    pdVar8 = (dun_data *)(*dun->profile->builder)(p,local_134,local_130,&local_140);
    if (pdVar8 == (dun_data *)0x0) {
      if (local_140 == (char *)0x0) {
        local_140 = "unspecified level builder failure";
      }
      if ((p->opts).opt[0x18] == true) {
        pcVar29 = "Generation restarted: %s.";
        msg("Generation restarted: %s.");
      }
      cleanup_dun_data((dun_data *)pcVar29);
      event_signal_flag(EVENT_GEN_LEVEL_END,false);
    }
    else {
      if ((dun->quest == true) && (z_info->quest_max != 0)) {
        uVar11 = 0;
        do {
          pqVar3 = player->quests;
          if (*(wchar_t *)&pdVar8->field_0xc == (uint)pqVar3[uVar11].level) {
            _Var4 = flag_has_dbg((pqVar3[uVar11].race)->flags,0xb,1,"q->race->flags","RF_UNIQUE");
            if (((!_Var4) || ((pqVar3[uVar11].race)->cur_num < L'\x01')) &&
               (L'\0' < pqVar3[uVar11].max_num)) {
              wVar6 = L'\0';
              do {
                find_empty((chunk_conflict *)pdVar8,&local_128);
                place_new_monster((chunk *)pdVar8,local_128,pqVar3[uVar11].race,true,true,
                                  (monster_group_info)0x0,'\n');
                wVar6 = wVar6 + L'\x01';
              } while (wVar6 < pqVar3[uVar11].max_num);
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < z_info->quest_max);
      }
      wVar6 = *(wchar_t *)&pdVar8->ent;
      if (L'\0' < wVar6) {
        wVar7 = *(wchar_t *)((long)&pdVar8->ent + 4);
        y_00 = L'\0';
        do {
          if (L'\0' < wVar7) {
            wVar6 = L'\0';
            do {
              lVar20 = (loc)loc(wVar6,y_00);
              psVar21 = square((chunk_conflict *)pdVar8,lVar20);
              flag_off(psVar21->info,3,0xb);
              psVar21 = square((chunk_conflict *)pdVar8,lVar20);
              flag_off(psVar21->info,3,0xc);
              psVar21 = square((chunk_conflict *)pdVar8,lVar20);
              flag_off(psVar21->info,3,0xd);
              psVar21 = square((chunk_conflict *)pdVar8,lVar20);
              flag_off(psVar21->info,3,0xe);
              _Var4 = square_isstairs((chunk_conflict *)pdVar8,lVar20);
              if (_Var4) {
                pcVar22 = (connector *)mem_zalloc(0x20);
                pcVar22->grid = lVar20;
                pfVar23 = square_feat((chunk_conflict *)pdVar8,lVar20);
                pcVar22->feat = (uint8_t)pfVar23->fidx;
                pbVar24 = (bitflag *)mem_zalloc(3);
                pcVar22->info = pbVar24;
                lVar28 = 0;
                do {
                  psVar21 = square((chunk_conflict *)pdVar8,lVar20);
                  pcVar22->info[lVar28] = psVar21->info[lVar28];
                  lVar28 = lVar28 + 1;
                } while (lVar28 != 3);
                pcVar22->next = pdVar8->join;
                pdVar8->join = pcVar22;
              }
              wVar6 = wVar6 + L'\x01';
              wVar7 = *(wchar_t *)((long)&pdVar8->ent + 4);
            } while (wVar6 < wVar7);
            wVar6 = *(wchar_t *)&pdVar8->ent;
          }
          y_00 = y_00 + L'\x01';
        } while (y_00 < wVar6);
      }
      dd = pdVar8;
      wVar6 = cave_monster_max((chunk_conflict *)pdVar8);
      if (wVar6 < (int)(uint)z_info->level_monster_max) {
        if (local_140 != (char *)0x0) goto LAB_00158ac4;
      }
      else {
        local_140 = "too many monsters";
LAB_00158ac4:
        if ((p->opts).opt[0x18] == true) {
          msg("Generation restarted: %s.");
        }
        uncreate_artifacts((chunk_conflict *)pdVar8);
        wipe_mon_list((chunk *)pdVar8,p);
        cave_free((chunk_conflict *)pdVar8);
        dd = (dun_data *)0x3a;
        event_signal_flag(EVENT_GEN_LEVEL_END,false);
      }
      cleanup_dun_data(dd);
    }
  } while ((local_12c < 99) && (uVar30 = local_12c + 1, local_140 != (char *)0x0));
  if (local_140 != (char *)0x0) {
    quit_fmt("cave_generate() failed 100 times!");
  }
  if (p->depth != 0) {
    if (z_info->feeling_total != 0) {
      uVar30 = 0;
      do {
        iVar26 = 500;
        do {
          uVar5 = Rand_div(*(wchar_t *)((long)&pdVar8->ent + 4));
          y = Rand_div(*(wchar_t *)&pdVar8->ent);
          lVar20 = (loc)loc(uVar5,y);
          _Var4 = square_allowsfeel((chunk_conflict *)pdVar8,lVar20);
          if ((_Var4) && (_Var4 = square_isfeel((chunk_conflict *)pdVar8,lVar20), !_Var4)) {
            psVar21 = square((chunk_conflict *)pdVar8,lVar20);
            flag_on_dbg(psVar21->info,3,8,"square(c, grid)->info","SQUARE_FEEL");
            break;
          }
          iVar26 = iVar26 + -1;
        } while (iVar26 != 0);
        uVar30 = uVar30 + 1;
      } while (uVar30 < z_info->feeling_total);
    }
    *(uint16_t *)&pdVar8->ent2room = 0;
  }
  wVar6 = *(wchar_t *)&pdVar8->field_0xc;
  if (wVar6 == L'\0') {
    cVar25 = '\0';
    bVar27 = 0;
  }
  else {
    if (*(_Bool *)((long)&pdVar8->ent_n + 4) == false) {
      uVar30 = *(uint32_t *)((long)&pdVar8->cent + 4) / (uint)wVar6;
LAB_00158c33:
      cVar25 = '\x14';
      if ((((uVar30 < 0x27101) && (cVar25 = '\x1e', uVar30 < 0x9c41)) &&
          (cVar25 = '(', uVar30 < 0x2711)) &&
         (((cVar25 = '2', uVar30 < 0x9c5 && (cVar25 = '<', uVar30 < 0x281)) &&
          ((cVar25 = 'F', uVar30 < 0xa1 && (cVar25 = 'P', uVar30 < 0x29)))))) {
        cVar25 = 'd';
        if (10 < uVar30) {
          cVar25 = 'Z';
        }
      }
    }
    else {
      cVar25 = '\n';
      if ((p->opts).opt[0x24] == false) {
        uVar30 = *(uint32_t *)((long)&pdVar8->cent + 4) / (uint)wVar6;
        cVar25 = '<';
        if (0x280 < uVar30) goto LAB_00158c33;
      }
    }
    uVar30 = *(uint *)&pdVar8->ent_n / (uint)wVar6;
    bVar27 = 1;
    if (((uVar30 < 0x1b59) && (bVar27 = 2, uVar30 < 0x1195)) &&
       ((bVar27 = 3, uVar30 < 0x9c5 &&
        ((((bVar27 = 4, uVar30 < 0x5dd && (bVar27 = 5, uVar30 < 0x321)) &&
          (bVar27 = 6, uVar30 < 0x191)) && (bVar27 = 7, uVar30 < 0x97)))))) {
      bVar27 = 0x32 < uVar30 ^ 9;
    }
  }
  *(byte *)&pdVar8->cent = cVar25 + bVar27;
  chunk_validate_objects((chunk_conflict *)pdVar8);
  pcVar9 = (chunk_conflict2 *)
           cave_new(*(wchar_t *)&pdVar8->ent,*(wchar_t *)((long)&pdVar8->ent + 4));
  p->cave = pcVar9;
  pcVar9->depth = *(wchar_t *)&pdVar8->field_0xc;
  ppoVar10 = (object **)mem_realloc(pcVar9->objects,(ulong)(ushort)pdVar8->block_hgt * 8 + 8);
  pcVar9 = p->cave;
  pcVar9->objects = ppoVar10;
  pcVar9->obj_max = (uint16_t)pdVar8->block_hgt;
  uVar11 = 0xffffffffffffffff;
  do {
    pcVar9->objects[uVar11 + 1] = (object *)0x0;
    pcVar9 = p->cave;
    uVar11 = uVar11 + 1;
  } while (uVar11 < pcVar9->obj_max);
  if (p->upkeep->light_level == true) {
    wiz_light((chunk *)pdVar8,p,false);
    p->upkeep->light_level = false;
  }
LAB_00158d68:
  pdVar8->cent_n = turn;
  return (chunk *)pdVar8;
}

Assistant:

static struct chunk *cave_generate(struct player *p, int height, int width)
{
	const char *error = "no generation";
	int i, tries = 0;
	struct chunk *chunk = NULL;

	/* Arena levels handled separately */
	if (p->upkeep->arena_level) {
		/* Generate level */
		event_signal_string(EVENT_GEN_LEVEL_START, "arena");
		chunk = arena_gen(p, height, width);

		/* Allocate new known level, light it if requested */
		p->cave = cave_new(chunk->height, chunk->width);
		p->cave->depth = chunk->depth;
		p->cave->objects = mem_realloc(p->cave->objects, (chunk->obj_max + 1)
									   * sizeof(struct object*));
		p->cave->obj_max = chunk->obj_max;
		for (i = 0; i <= p->cave->obj_max; i++) {
			p->cave->objects[i] = NULL;
		}

		wiz_light(chunk, p, false);
		chunk->turn = turn;

		return chunk;
	}

	/* Generate */
	for (tries = 0; tries < 100 && error; tries++) {
		int y, x;
		struct dun_data dun_body;

		error = NULL;

		/* Mark the dungeon as being unready (to avoid artifact loss, etc) */
		character_dungeon = false;

		/* Allocate global data (will be freed when we leave the loop) */
		dun = &dun_body;
		dun->cent = mem_zalloc(z_info->level_room_max * sizeof(struct loc));
		dun->ent_n = mem_zalloc(z_info->level_room_max * sizeof(*dun->ent_n));
		dun->ent = mem_zalloc(z_info->level_room_max * sizeof(*dun->ent));
		dun->ent2room = NULL;
		dun->door = mem_zalloc(z_info->level_door_max * sizeof(struct loc));
		dun->wall = mem_zalloc(z_info->wall_pierce_max * sizeof(struct loc));
		dun->tunn = mem_zalloc(z_info->tunn_grid_max * sizeof(struct loc));
		dun->join = NULL;
		dun->one_off_above = NULL;
		dun->one_off_below = NULL;
		dun->curr_join = NULL;
		dun->nstair_room = 0;
		dun->quest = is_quest(p, p->depth);

		/* Get connector info for persistent levels */
		if (OPT(p, birth_levels_persist)) {
			dun->persist = true;
			get_join_info(p, dun);
		} else {
			dun->persist = false;
		}


		/* Choose a profile and build the level */
		dun->profile = choose_profile(p);
		event_signal_string(EVENT_GEN_LEVEL_START, dun->profile->name);
		chunk = dun->profile->builder(p, height, width, &error);
		if (!chunk) {
			if (!error) {
				error = "unspecified level builder failure";
			}
			if (OPT(p, cheat_room)) {
				msg("Generation restarted: %s.", error);
			}
			cleanup_dun_data(dun);
			event_signal_flag(EVENT_GEN_LEVEL_END, false);
			continue;
		}

		/* Ensure quest monsters */
		if (dun->quest) {
			for (i = 0; i < z_info->quest_max; i++) {
				struct quest *q = &player->quests[i];
				struct monster_group_info info = { 0, 0 };
				struct loc grid;

				if (q->level != chunk->depth) continue;

				/* If the quest monster is unique and has already been placed, don't place again */
				if (rf_has(q->race->flags, RF_UNIQUE) && q->race->cur_num > 0) continue;

				/* Pick a location and place the monster(s) */
				for (int n = 0; n < q->max_num; n++) {
					find_empty(chunk, &grid);
					place_new_monster(chunk, grid, q->race, true, true, info,
									  ORIGIN_DROP);
				}
			}
		}

		/* Clear generation flags, add connecting info */
		for (y = 0; y < chunk->height; y++) {
			for (x = 0; x < chunk->width; x++) {
				struct loc grid = loc(x, y);

				sqinfo_off(square(chunk, grid)->info, SQUARE_WALL_INNER);
				sqinfo_off(square(chunk, grid)->info, SQUARE_WALL_OUTER);
				sqinfo_off(square(chunk, grid)->info, SQUARE_WALL_SOLID);
				sqinfo_off(square(chunk, grid)->info, SQUARE_MON_RESTRICT);

				if (square_isstairs(chunk, grid)) {
					size_t n;
					struct connector *new = mem_zalloc(sizeof *new);
					new->grid = grid;
					new->feat = square_feat(chunk, grid)->fidx;
					new->info = mem_zalloc(SQUARE_SIZE * sizeof(bitflag));
					for (n = 0; n < SQUARE_SIZE; n++) {
						new->info[n] = square(chunk, grid)->info[n];
					}
					new->next = chunk->join;
					chunk->join = new;
				}
			}
		}

		/* Regenerate levels that overflow their maxima */
		if (cave_monster_max(chunk) >= z_info->level_monster_max)
			error = "too many monsters";

		if (error) {
			if (OPT(p, cheat_room)) {
				msg("Generation restarted: %s.", error);
			}
			uncreate_artifacts(chunk);
			cave_clear(chunk, p);
			event_signal_flag(EVENT_GEN_LEVEL_END, false);
		}

		cleanup_dun_data(dun);
	}

	if (error) quit_fmt("cave_generate() failed 100 times!");

	/* Place dungeon squares to trigger feeling (not in town) */
	if (p->depth) {
		place_feeling(chunk);
	}

	chunk->feeling = calc_obj_feeling(chunk, p) + calc_mon_feeling(chunk);

	/* Validate the dungeon (we could use more checks here) */
	chunk_validate_objects(chunk);

	/* Allocate new known level, light it if requested */
	p->cave = cave_new(chunk->height, chunk->width);
	p->cave->depth = chunk->depth;
	p->cave->objects = mem_realloc(p->cave->objects, (chunk->obj_max + 1)
								   * sizeof(struct object*));
	p->cave->obj_max = chunk->obj_max;
	for (i = 0; i <= p->cave->obj_max; i++) {
		p->cave->objects[i] = NULL;
	}
	if (p->upkeep->light_level) {
		wiz_light(chunk, p, false);
		p->upkeep->light_level = false;
	}

	chunk->turn = turn;

	return chunk;
}